

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O0

void __thiscall Assimp::MDLImporter::SearchPalette(MDLImporter *this,uchar **pszColorMap)

{
  IOSystem *this_00;
  int iVar1;
  IOStream *pIVar2;
  undefined4 extraout_var;
  Logger *this_01;
  uchar *colorMap;
  size_t len;
  uchar *szColorMap;
  allocator<char> local_41;
  string local_40;
  IOStream *local_20;
  IOStream *pcStream;
  uchar **pszColorMap_local;
  MDLImporter *this_local;
  
  this_00 = this->pIOHandler;
  pcStream = (IOStream *)pszColorMap;
  pszColorMap_local = (uchar **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"rb",&local_41);
  pIVar2 = IOSystem::Open(this_00,&this->configPalette,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  len = (size_t)g_aclrDefaultColorMap;
  if (pIVar2 != (IOStream *)0x0) {
    local_20 = pIVar2;
    iVar1 = (*pIVar2->_vptr_IOStream[6])();
    if (0x2ff < CONCAT44(extraout_var,iVar1)) {
      len = (size_t)operator_new__(0x300);
      (*local_20->_vptr_IOStream[2])(local_20,len,0x300,1);
      this_01 = DefaultLogger::get();
      Logger::info(this_01,
                   "Found valid colormap.lmp in directory. It will be used to decode embedded textures in palletized formats."
                  );
    }
    if (local_20 != (IOStream *)0x0) {
      (*local_20->_vptr_IOStream[1])();
    }
  }
  pcStream->_vptr_IOStream = (_func_int **)len;
  return;
}

Assistant:

void MDLImporter::SearchPalette(const unsigned char** pszColorMap)
{
    // now try to find the color map in the current directory
    IOStream* pcStream = pIOHandler->Open(configPalette,"rb");

    const unsigned char* szColorMap = (const unsigned char*)::g_aclrDefaultColorMap;
    if(pcStream)
    {
        if (pcStream->FileSize() >= 768)
        {
            size_t len = 256 * 3;
            unsigned char* colorMap = new unsigned char[len];
            szColorMap = colorMap;
            pcStream->Read(colorMap, len,1);
            ASSIMP_LOG_INFO("Found valid colormap.lmp in directory. "
                "It will be used to decode embedded textures in palletized formats.");
        }
        delete pcStream;
        pcStream = NULL;
    }
    *pszColorMap = szColorMap;
}